

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1327:13)>
::getImpl(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1327:13)>
          *this,ExceptionOrValue *output)

{
  Fault f;
  ExceptionOr<kj::_::Void> depResult;
  Fault local_378;
  ExceptionOr<kj::_::Void> local_370;
  ExceptionOrValue local_1d0;
  char local_38;
  
  local_1d0.exception.ptr.isSet = false;
  local_38 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1d0);
  if (local_1d0.exception.ptr.isSet == true) {
    local_370.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1d0.exception.ptr.field_1.value.ownFile.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1d0.exception.ptr.field_1.value.ownFile.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1d0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1d0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1d0.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1d0.exception.ptr.field_1.value.file;
    local_370.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1d0.exception.ptr.field_1._32_8_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1d0.exception.ptr.field_1.value.description.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1d0.exception.ptr.field_1.value.description.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1d0.exception.ptr.field_1.value.description.content.disposer;
    local_1d0.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1d0.exception.ptr.field_1.value.description.content.size_ = 0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1d0.exception.ptr.field_1.value.context.ptr.disposer;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_1d0.exception.ptr.field_1.value.context.ptr.ptr;
    local_1d0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1d0.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1d0.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1d0.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1d0.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1d0.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_370.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1d0.exception.ptr.field_1 + 0x68),0x105);
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1d0.exception.ptr.field_1.value.details.builder.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1d0.exception.ptr.field_1.value.details.builder.pos;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1d0.exception.ptr.field_1.value.details.builder.endPtr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1d0.exception.ptr.field_1.value.details.builder.disposer;
    local_1d0.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1d0.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1d0.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_370.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_370);
  }
  else {
    if (local_38 != '\x01') goto LAB_0019e99f;
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[4]>
              (&local_378,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x52f,FAILED,(char *)0x0,"\"foo\"",(char (*) [4])0x4f8544);
    Debug::Fault::~Fault(&local_378);
    local_370.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_370.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_370);
  }
  if (local_370.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_370.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_0019e99f:
  if (local_1d0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1d0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }